

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O0

void TPZShapeHCurl<pzshape::TPZShapeCube>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *curlphi)

{
  int iVar1;
  int iVar2;
  int64_t iVar3;
  pair<int,_long> *ppVar4;
  double *pdVar5;
  int iVar6;
  int iVar7;
  long in_RSI;
  double dVar8;
  double dVar9;
  double dVar10;
  int dj;
  int di;
  int d_1;
  int d;
  int scalindex;
  int vecindex;
  pair<int,_long> *it;
  int i;
  int curldim;
  int dim;
  int nsides;
  int ncorner;
  TPZShapeData *in_stack_00001758;
  TPZVec<double> *in_stack_00001760;
  double in_stack_ffffffffffffff80;
  double in_stack_ffffffffffffff88;
  TPZFMatrix<double> *in_stack_ffffffffffffff90;
  int local_50;
  int local_4c;
  int local_34;
  
  TPZShapeH1<pzshape::TPZShapeCube>::Shape(in_stack_00001760,in_stack_00001758);
  local_34 = 0;
  while( true ) {
    iVar3 = TPZVec<std::pair<int,_long>_>::size((TPZVec<std::pair<int,_long>_> *)(in_RSI + 0x3510));
    if (iVar3 <= local_34) break;
    ppVar4 = TPZVec<std::pair<int,_long>_>::operator[]
                       ((TPZVec<std::pair<int,_long>_> *)(in_RSI + 0x3510),(long)local_34);
    iVar1 = ppVar4->first;
    iVar2 = (int)ppVar4->second;
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                          (int64_t)in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff90 = (TPZFMatrix<double> *)*pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                          (int64_t)in_stack_ffffffffffffff80);
      dVar8 = (double)in_stack_ffffffffffffff90 * *pdVar5;
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                          (int64_t)in_stack_ffffffffffffff80);
      *pdVar5 = dVar8;
    }
    for (local_50 = 0; local_50 < 3; local_50 = local_50 + 1) {
      iVar6 = (local_50 + 1) % 3;
      iVar7 = (local_50 + 2) % 3;
      in_stack_ffffffffffffff80 =
           TPZFMatrix<double>::GetVal
                     ((TPZFMatrix<double> *)(in_RSI + 0x2518),(long)iVar6,(long)iVar2);
      dVar8 = TPZFMatrix<double>::GetVal
                        ((TPZFMatrix<double> *)(in_RSI + 0x2ce0),(long)iVar7,(long)iVar1);
      dVar9 = TPZFMatrix<double>::GetVal
                        ((TPZFMatrix<double> *)(in_RSI + 0x2518),(long)iVar7,(long)iVar2);
      dVar10 = TPZFMatrix<double>::GetVal
                         ((TPZFMatrix<double> *)(in_RSI + 0x2ce0),(long)iVar6,(long)iVar1);
      in_stack_ffffffffffffff88 = in_stack_ffffffffffffff80 * dVar8 + -(dVar9 * dVar10);
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,
                          (int64_t)in_stack_ffffffffffffff80);
      *pdVar5 = in_stack_ffffffffffffff88;
    }
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void TPZShapeHCurl<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &curlphi)
{

    constexpr int ncorner = TSHAPE::NCornerNodes;
    constexpr int nsides = TSHAPE::NSides;
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    
    TPZShapeH1<TSHAPE>::Shape(pt,data);
    for(int i = 0; i< data.fSDVecShapeIndex.size(); i++)
    {
        const auto &it = data.fSDVecShapeIndex[i];
        const int vecindex = it.first;
        const int scalindex = it.second;
        
        for(int d = 0; d<TSHAPE::Dimension; d++)
        {
            phi(d,i) = data.fPhi(scalindex,0)*data.fMasterDirections(d,vecindex);
        }

        if constexpr (dim==1){
            curlphi(0,i) =
                data.fDPhi.GetVal( 0,vecindex) *
                data.fMasterDirections.GetVal(0,vecindex);
        }else if constexpr (dim==2){
            curlphi(0,i) =
                data.fDPhi.GetVal(0,scalindex) *
                data.fMasterDirections.GetVal(1,vecindex) -
                data.fDPhi.GetVal(1,scalindex) *
                data.fMasterDirections.GetVal(0,vecindex);
            }
        else if constexpr(dim==3){
            for(auto d = 0; d < dim; d++) {
                const auto di = (d+1)%dim;
                const auto dj = (d+2)%dim;
                curlphi(d,i) =
                    data.fDPhi.GetVal(di,scalindex) *
                    data.fMasterDirections.GetVal(dj,vecindex)-
                    data.fDPhi.GetVal(dj,scalindex) *
                    data.fMasterDirections.GetVal(di,vecindex);
            }
        }else{
            if constexpr (std::is_same_v<TSHAPE,TSHAPE>){
                static_assert(!sizeof(TSHAPE),"Invalid curl dimension");
            }
        }        
    }
}